

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::PrevTransition
          (TimeZoneInfo *this,time_point<seconds> *tp,civil_transition *trans)

{
  int_least8_t iVar1;
  int_least8_t iVar2;
  int_least8_t iVar3;
  int_least8_t iVar4;
  int_least8_t iVar5;
  undefined3 uVar6;
  bool bVar7;
  Transition *pTVar8;
  uint_least8_t *puVar9;
  Transition *pTVar10;
  Transition *pTVar11;
  fields fVar12;
  
  pTVar8 = (this->transitions_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar8 == (this->transitions_).
                super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    bVar7 = false;
  }
  else {
    pTVar11 = pTVar8 + 1;
    if (-0x800000000000000 < pTVar8->unix_time) {
      pTVar11 = pTVar8;
    }
    pTVar8 = std::
             __lower_bound<absl::lts_20250127::time_internal::cctz::Transition_const*,absl::lts_20250127::time_internal::cctz::Transition,__gnu_cxx::__ops::_Iter_comp_val<absl::lts_20250127::time_internal::cctz::Transition::ByUnixTime>>
                       (pTVar11);
    do {
      pTVar10 = pTVar8;
      if (pTVar10 == pTVar11) break;
      puVar9 = &pTVar10[-2].type_index;
      if (pTVar10 + -1 == pTVar11) {
        puVar9 = &this->default_transition_type_;
      }
      bVar7 = EquivTransitions(this,*puVar9,pTVar10[-1].type_index);
      pTVar8 = pTVar10 + -1;
    } while (bVar7);
    bVar7 = pTVar10 != pTVar11;
    if (bVar7) {
      fVar12 = (fields)detail::operator+((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                          )pTVar10[-1].prev_civil_sec.f_,1);
      (trans->from).f_ = fVar12;
      iVar1 = pTVar10[-1].civil_sec.f_.m;
      iVar2 = pTVar10[-1].civil_sec.f_.d;
      iVar3 = pTVar10[-1].civil_sec.f_.hh;
      iVar4 = pTVar10[-1].civil_sec.f_.mm;
      iVar5 = pTVar10[-1].civil_sec.f_.ss;
      uVar6 = *(undefined3 *)&pTVar10[-1].civil_sec.f_.field_0xd;
      (trans->to).f_.y = pTVar10[-1].civil_sec.f_.y;
      (trans->to).f_.m = iVar1;
      (trans->to).f_.d = iVar2;
      (trans->to).f_.hh = iVar3;
      (trans->to).f_.mm = iVar4;
      (trans->to).f_.ss = iVar5;
      *(undefined3 *)&(trans->to).f_.field_0xd = uVar6;
    }
  }
  return bVar7;
}

Assistant:

bool TimeZoneInfo::PrevTransition(const time_point<seconds>& tp,
                                  time_zone::civil_transition* trans) const {
  if (transitions_.empty()) return false;
  const Transition* begin = &transitions_[0];
  const Transition* end = begin + transitions_.size();
  if (begin->unix_time <= -(1LL << 59)) {
    // Do not report the BIG_BANG found in some zoneinfo data as it is
    // really a sentinel, not a transition.  See pre-2018f tz/zic.c.
    ++begin;
  }
  std::int_fast64_t unix_time = ToUnixSeconds(tp);
  if (FromUnixSeconds(unix_time) != tp) {
    if (unix_time == std::numeric_limits<std::int_fast64_t>::max()) {
      if (end == begin) return false;  // Ignore future_spec_.
      trans->from = (--end)->prev_civil_sec + 1;
      trans->to = end->civil_sec;
      return true;
    }
    unix_time += 1;  // ceils
  }
  const Transition target = {unix_time, 0, civil_second(), civil_second()};
  const Transition* tr =
      std::lower_bound(begin, end, target, Transition::ByUnixTime());
  for (; tr != begin; --tr) {  // skip no-op transitions
    std::uint_fast8_t prev_type_index =
        (tr - 1 == begin) ? default_transition_type_ : tr[-2].type_index;
    if (!EquivTransitions(prev_type_index, tr[-1].type_index)) break;
  }
  // When tr == end we return the "last" transition, ignoring future_spec_.
  if (tr == begin) return false;
  trans->from = (--tr)->prev_civil_sec + 1;
  trans->to = tr->civil_sec;
  return true;
}